

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O3

HighsStatus reportIpxSolveStatus(HighsOptions *options,Int solve_status,Int error_flag)

{
  ulong uVar1;
  char *pcVar2;
  HighsLogOptions *log_options_;
  
  uVar1 = (ulong)(uint)error_flag;
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  switch(solve_status) {
  case 1000:
    highsLogUser(log_options_,kInfo,"Ipx: Solved\n");
    return kOk;
  default:
    pcVar2 = "Ipx: unrecognised solve status = %d\n";
    uVar1 = (ulong)(uint)solve_status;
    break;
  case 0x3eb:
    pcVar2 = "Ipx: Out of memory\n";
    goto LAB_00201f57;
  case 0x3ec:
    pcVar2 = "Ipx: Internal error %d\n";
    break;
  case 0x3ed:
    highsLogUser(log_options_,kWarning,"Ipx: Stopped\n");
    return kWarning;
  case 0x3ee:
    switch(error_flag) {
    case 0x66:
      pcVar2 = "Ipx: Invalid input - argument_null\n";
      break;
    case 0x67:
      pcVar2 = "Ipx: Invalid input - invalid dimension\n";
      break;
    case 0x68:
      pcVar2 = "Ipx: Invalid input - invalid matrix\n";
      break;
    case 0x69:
      pcVar2 = "Ipx: Invalid input - invalid vector\n";
      break;
    default:
      pcVar2 = "Ipx: Invalid input - unrecognised error\n";
      break;
    case 0x6b:
      pcVar2 = "Ipx: Invalid input - invalid basis\n";
    }
LAB_00201f57:
    highsLogUser(log_options_,kError,pcVar2);
    return kError;
  }
  highsLogUser(log_options_,kError,pcVar2,uVar1);
  return kError;
}

Assistant:

HighsStatus reportIpxSolveStatus(const HighsOptions& options,
                                 const ipx::Int solve_status,
                                 const ipx::Int error_flag) {
  if (solve_status == IPX_STATUS_solved) {
    highsLogUser(options.log_options, HighsLogType::kInfo, "Ipx: Solved\n");
    return HighsStatus::kOk;
  } else if (solve_status == IPX_STATUS_stopped) {
    highsLogUser(options.log_options, HighsLogType::kWarning, "Ipx: Stopped\n");
    return HighsStatus::kWarning;
    // Remaining cases are errors so drop through to return HighsStatus::kError;
  } else if (solve_status == IPX_STATUS_no_model) {
    if (error_flag == IPX_ERROR_argument_null) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - argument_null\n");
    } else if (error_flag == IPX_ERROR_invalid_dimension) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - invalid dimension\n");
    } else if (error_flag == IPX_ERROR_invalid_matrix) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - invalid matrix\n");
    } else if (error_flag == IPX_ERROR_invalid_vector) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - invalid vector\n");
    } else if (error_flag == IPX_ERROR_invalid_basis) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - invalid basis\n");
    } else {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Ipx: Invalid input - unrecognised error\n");
    }
  } else if (solve_status == IPX_STATUS_out_of_memory) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Ipx: Out of memory\n");
  } else if (solve_status == IPX_STATUS_internal_error) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Ipx: Internal error %" HIGHSINT_FORMAT "\n", (int)error_flag);
  } else {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Ipx: unrecognised solve status = %" HIGHSINT_FORMAT "\n",
                 (int)solve_status);
  }
  return HighsStatus::kError;
}